

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-timesamples-array.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseTimeSampleValueOfArrayType
          (AsciiParser *this,uint32_t type_id,Value *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  ostream *poVar4;
  long *plVar5;
  size_type *psVar6;
  size_type *psVar7;
  uint32_t tyid;
  uint32_t tyid_00;
  uint32_t tyid_01;
  uint32_t tyid_02;
  uint32_t tyid_03;
  int iVar8;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> typed_val;
  Value val;
  ostringstream ss_e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  vector<double,_std::allocator<double>_> local_218;
  string local_1f8;
  string local_1d8;
  storage_union local_1b8;
  undefined **local_1a8;
  storage_union local_1a0;
  undefined1 *local_190;
  ios_base local_130 [264];
  
  if (result == (Value *)0x0) {
    return false;
  }
  bVar2 = MaybeNone(this);
  if (bVar2) {
    local_190 = linb::any::vtable_for_type<tinyusdz::value::ValueBlock>()::table;
    linb::any::swap((any *)&local_1a0,&result->v_);
    if (local_190 != (undefined1 *)0x0) {
      (**(code **)(local_190 + 0x20))(&local_1a0);
    }
    return true;
  }
  local_1a8 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_1b8.dynamic = (void *)0x0;
  switch(type_id) {
  case 6:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<tinyusdz::Token>
                      (this,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_218)
    ;
    if (bVar2) {
      local_190 = linb::any::
                  vtable_for_type<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>()::
                  table;
      pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar3,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_218);
      local_1a0.dynamic = pvVar3;
      linb::any::operator=((any *)&local_1b8,(any *)&local_1a0);
      if (local_190 != (undefined1 *)0x0) {
        (**(code **)(local_190 + 0x20))(&local_1a0);
        local_190 = (undefined1 *)0x0;
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<(&local_1a0,0xa6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1d8,(value *)(ulong)type_id,tyid_01);
      plVar5 = (long *)::std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x40ea18);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_1f8.field_2._M_allocated_capacity = *psVar6;
        local_1f8.field_2._8_8_ = plVar5[3];
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      }
      else {
        local_1f8.field_2._M_allocated_capacity = *psVar6;
        local_1f8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_1f8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)::std::__cxx11::string::append((char *)&local_1f8);
      paVar1 = &local_238.field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_238.field_2._M_allocated_capacity = *psVar7;
        local_238.field_2._8_8_ = plVar5[3];
        local_238._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_238.field_2._M_allocated_capacity = *psVar7;
        local_238._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_238._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a0,local_238._M_dataplus._M_p,
                          local_238._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar1) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar1) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
      ::std::ios_base::~ios_base(local_130);
    }
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_218);
    goto LAB_003e9ab2;
  case 7:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<std::__cxx11::string>
                      (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_218);
    if (bVar2) {
      local_190 = linb::any::
                  vtable_for_type<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>()
                  ::table;
      pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)pvVar3,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_218);
      local_1a0.dynamic = pvVar3;
      linb::any::operator=((any *)&local_1b8,(any *)&local_1a0);
      if (local_190 != (undefined1 *)0x0) {
        (**(code **)(local_190 + 0x20))(&local_1a0);
        local_190 = (undefined1 *)0x0;
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<(&local_1a0,0xa7);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1d8,(value *)(ulong)type_id,tyid_02);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1f8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1d8);
      plVar5 = (long *)::std::__cxx11::string::append((char *)&local_1f8);
      paVar1 = &local_238.field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_238.field_2._M_allocated_capacity = *psVar7;
        local_238.field_2._8_8_ = plVar5[3];
        local_238._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_238.field_2._M_allocated_capacity = *psVar7;
        local_238._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_238._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a0,local_238._M_dataplus._M_p,
                          local_238._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar1) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar1) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
      ::std::ios_base::~ios_base(local_130);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_218);
    goto LAB_003e9ab2;
  default:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
               ,0x68);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<(&local_1a0,0xcb);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    tinyusdz::value::GetTypeName_abi_cxx11_(&local_1f8,(value *)(ulong)type_id,tyid);
    ::std::operator+(&local_238," : TODO: timeSamples type ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8
                    );
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a0,local_238._M_dataplus._M_p,local_238._M_string_length)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
    ::std::ios_base::~ios_base(local_130);
    goto LAB_003e9acb;
  case 0xe:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<tinyusdz::value::half>
                      (this,(vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *
                            )&local_218);
    if (bVar2) {
      local_190 = linb::any::
                  vtable_for_type<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>()
                  ::table;
      pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
      ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::vector
                ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)pvVar3,
                 (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)&local_218
                );
      break;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
               ,0x68);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
    iVar8 = 0xad;
LAB_003e993b:
    poVar4 = (ostream *)::std::ostream::operator<<(&local_1a0,iVar8);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    tinyusdz::value::GetTypeName_abi_cxx11_(&local_1d8,(value *)(ulong)type_id,tyid_03);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8
                     ,"Failed to parse value with requested type `",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                    );
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_1f8);
    paVar1 = &local_238.field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_238.field_2._M_allocated_capacity = *psVar7;
      local_238.field_2._8_8_ = plVar5[3];
      local_238._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar7;
      local_238._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_238._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a0,local_238._M_dataplus._M_p,local_238._M_string_length)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar1) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar1) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
    ::std::ios_base::~ios_base(local_130);
    goto LAB_003e9a9b;
  case 0xf:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<int>(this,(vector<int,_std::allocator<int>_> *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xa9;
      goto LAB_003e993b;
    }
    local_190 = linb::any::vtable_for_type<std::vector<int,std::allocator<int>>>()::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)pvVar3,
               (vector<int,_std::allocator<int>_> *)&local_218);
    break;
  case 0x10:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<long>(this,(vector<long,_std::allocator<long>_> *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xab;
      goto LAB_003e993b;
    }
    local_190 = linb::any::vtable_for_type<std::vector<long,std::allocator<long>>>()::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)pvVar3,
               (vector<long,_std::allocator<long>_> *)&local_218);
    break;
  case 0x11:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<std::array<tinyusdz::value::half,2ul>>
                      (this,(vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xae;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::
    vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
    ::vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
              *)pvVar3,
             (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
              *)&local_218);
    break;
  case 0x12:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<std::array<tinyusdz::value::half,3ul>>
                      (this,(vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xaf;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::
    vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
    ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
              *)pvVar3,
             (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
              *)&local_218);
    break;
  case 0x13:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<std::array<tinyusdz::value::half,4ul>>
                      (this,(vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xb0;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::
    vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
    ::vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
              *)pvVar3,
             (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
              *)&local_218);
    break;
  case 0x1b:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<unsigned_int>
                      (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xaa;
      goto LAB_003e993b;
    }
    local_190 = linb::any::vtable_for_type<std::vector<unsigned_int,std::allocator<unsigned_int>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar3,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_218);
    break;
  case 0x1c:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<unsigned_long>
                      (this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xac;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<unsigned_long,std::allocator<unsigned_long>>>()::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)pvVar3,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_218);
    break;
  case 0x28:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<float>(this,(vector<float,_std::allocator<float>_> *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xa8;
      goto LAB_003e993b;
    }
    local_190 = linb::any::vtable_for_type<std::vector<float,std::allocator<float>>>()::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)pvVar3,
               (vector<float,_std::allocator<float>_> *)&local_218);
    break;
  case 0x29:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<std::array<float,2ul>>
                      (this,(vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xb2;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::vector
              ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)pvVar3,
               (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
               &local_218);
    break;
  case 0x2a:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<std::array<float,3ul>>
                      (this,(vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xb3;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
              ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)pvVar3,
               (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
               &local_218);
    break;
  case 0x2b:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<std::array<float,4ul>>
                      (this,(vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xb4;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::vector
              ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)pvVar3,
               (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
               &local_218);
    break;
  case 0x2c:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<double>(this,&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xb5;
      goto LAB_003e993b;
    }
    local_190 = linb::any::vtable_for_type<std::vector<double,std::allocator<double>>>()::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<double,_std::allocator<double>_>::vector(pvVar3,&local_218);
    break;
  case 0x2d:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<std::array<double,2ul>>
                      (this,(vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xb6;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::vector
              ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)pvVar3,
               (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
               &local_218);
    break;
  case 0x2e:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<std::array<double,3ul>>
                      (this,(vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xb7;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)pvVar3,
               (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               &local_218);
    break;
  case 0x2f:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<std::array<double,4ul>>
                      (this,(vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xb8;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::vector
              ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)pvVar3,
               (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
               &local_218);
    break;
  case 0x30:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<tinyusdz::value::quath>
                      (this,(vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xb9;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::vector
              ((vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)pvVar3,
               (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)&local_218
              );
    break;
  case 0x31:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<tinyusdz::value::quatf>
                      (this,(vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xba;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::vector
              ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)pvVar3,
               (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)&local_218
              );
    break;
  case 0x32:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<tinyusdz::value::quatd>
                      (this,(vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xbb;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::vector
              ((vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)pvVar3,
               (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)&local_218
              );
    break;
  case 0x33:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<tinyusdz::value::matrix2f>
                      (this,(vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xc5;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::matrix2f,std::allocator<tinyusdz::value::matrix2f>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>::vector
              ((vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> *)
               pvVar3,(vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                       *)&local_218);
    break;
  case 0x34:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<tinyusdz::value::matrix3f>
                      (this,(vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xc6;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::matrix3f,std::allocator<tinyusdz::value::matrix3f>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::vector
              ((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)
               pvVar3,(vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                       *)&local_218);
    break;
  case 0x35:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<tinyusdz::value::matrix4f>
                      (this,(vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 199;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::matrix4f,std::allocator<tinyusdz::value::matrix4f>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::vector
              ((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *)
               pvVar3,(vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                       *)&local_218);
    break;
  case 0x36:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<tinyusdz::value::matrix2d>
                      (this,(vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 200;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::matrix2d,std::allocator<tinyusdz::value::matrix2d>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::vector
              ((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
               pvVar3,(vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                       *)&local_218);
    break;
  case 0x37:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<tinyusdz::value::matrix3d>
                      (this,(vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xc9;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::matrix3d,std::allocator<tinyusdz::value::matrix3d>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::vector
              ((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
               pvVar3,(vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                       *)&local_218);
    break;
  case 0x38:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<tinyusdz::value::matrix4d>
                      (this,(vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xca;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::vector
              ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
               pvVar3,(vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                       *)&local_218);
    break;
  case 0x3a:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<tinyusdz::value::color3f>
                      (this,(vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xbc;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::vector
              ((vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)pvVar3
               ,(vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                &local_218);
    break;
  case 0x3b:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<tinyusdz::value::color3d>
                      (this,(vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xbe;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::vector
              ((vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)pvVar3
               ,(vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                &local_218);
    break;
  case 0x3d:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<tinyusdz::value::color4f>
                      (this,(vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xbd;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::vector
              ((vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)pvVar3
               ,(vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                &local_218);
    break;
  case 0x3e:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<tinyusdz::value::color4d>
                      (this,(vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xbf;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::vector
              ((vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)pvVar3
               ,(vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                &local_218);
    break;
  case 0x40:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<tinyusdz::value::point3f>
                      (this,(vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xc2;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::vector
              ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)pvVar3
               ,(vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                &local_218);
    break;
  case 0x43:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<tinyusdz::value::normal3f>
                      (this,(vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xc1;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::vector
              ((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
               pvVar3,(vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                       *)&local_218);
    break;
  case 0x46:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<tinyusdz::value::vector3f>
                      (this,(vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xc0;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::vector
              ((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
               pvVar3,(vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                       *)&local_218);
    break;
  case 0x4a:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<tinyusdz::value::texcoord2f>
                      (this,(vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xc3;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::vector
              ((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *)
               pvVar3,(vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                       *)&local_218);
    break;
  case 0x4d:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<tinyusdz::value::texcoord3f>
                      (this,(vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                             *)&local_218);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      iVar8 = 0xc4;
      goto LAB_003e993b;
    }
    local_190 = linb::any::
                vtable_for_type<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>()
                ::table;
    pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    ::std::vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::vector
              ((vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *)
               pvVar3,(vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                       *)&local_218);
    break;
  case 0x51:
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ParseBasicTypeArray<tinyusdz::value::AssetPath>
                      (this,(vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                             *)&local_218);
    if (bVar2) {
      local_190 = linb::any::
                  vtable_for_type<std::vector<tinyusdz::value::AssetPath,std::allocator<tinyusdz::value::AssetPath>>>()
                  ::table;
      pvVar3 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
      ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::vector
                ((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
                 pvVar3,(vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                         *)&local_218);
      local_1a0.dynamic = pvVar3;
      linb::any::operator=((any *)&local_1b8,(any *)&local_1a0);
      if (local_190 != (undefined1 *)0x0) {
        (**(code **)(local_190 + 0x20))(&local_1a0);
        local_190 = (undefined1 *)0x0;
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                 ,0x68);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"ParseTimeSampleValueOfArrayType",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<(&local_1a0,0xa5);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1d8,(value *)(ulong)type_id,tyid_00);
      plVar5 = (long *)::std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x40ea18);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_1f8.field_2._M_allocated_capacity = *psVar6;
        local_1f8.field_2._8_8_ = plVar5[3];
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      }
      else {
        local_1f8.field_2._M_allocated_capacity = *psVar6;
        local_1f8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_1f8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)::std::__cxx11::string::append((char *)&local_1f8);
      paVar1 = &local_238.field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_238.field_2._M_allocated_capacity = *psVar7;
        local_238.field_2._8_8_ = plVar5[3];
        local_238._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_238.field_2._M_allocated_capacity = *psVar7;
        local_238._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_238._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a0,local_238._M_dataplus._M_p,
                          local_238._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar1) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar1) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
      ::std::ios_base::~ios_base(local_130);
    }
    ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::~vector
              ((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
               &local_218);
    goto LAB_003e9ab2;
  }
  local_1a0.dynamic = pvVar3;
  linb::any::operator=((any *)&local_1b8,(any *)&local_1a0);
  if (local_190 != (undefined1 *)0x0) {
    (**(code **)(local_190 + 0x20))(&local_1a0);
    local_190 = (undefined1 *)0x0;
  }
LAB_003e9a9b:
  if (local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_003e9ab2:
  if (bVar2 == false) {
LAB_003e9acb:
    bVar2 = false;
  }
  else {
    linb::any::operator=(&result->v_,(any *)&local_1b8);
    bVar2 = true;
  }
  if (local_1a8 != (undefined **)0x0) {
    (*(code *)local_1a8[4])(&local_1b8);
  }
  return bVar2;
}

Assistant:

bool AsciiParser::ParseTimeSampleValueOfArrayType(const uint32_t type_id, value::Value *result) {

  if (!result) {
    return false;
  }

  if (MaybeNone()) {
    (*result) = value::ValueBlock();
    return true;
  }

  value::Value val;

#define PARSE_TYPE(__tyid, __type)                       \
  if (__tyid == value::TypeTraits<__type>::type_id()) {             \
    std::vector<__type> typed_val; \
    if (!ParseBasicTypeArray(&typed_val)) {                             \
      PUSH_ERROR_AND_RETURN("Failed to parse value with requested type `" + value::GetTypeName(__tyid) + "[]`"); \
    }                                                                  \
    val = value::Value(typed_val); \
  } else

  // NOTE: `string` does not support multi-line string.
  PARSE_TYPE(type_id, value::AssetPath)
  PARSE_TYPE(type_id, value::token)
  PARSE_TYPE(type_id, std::string)
  PARSE_TYPE(type_id, float)
  PARSE_TYPE(type_id, int32_t)
  PARSE_TYPE(type_id, uint32_t)
  PARSE_TYPE(type_id, int64_t)
  PARSE_TYPE(type_id, uint64_t)
  PARSE_TYPE(type_id, value::half)
  PARSE_TYPE(type_id, value::half2)
  PARSE_TYPE(type_id, value::half3)
  PARSE_TYPE(type_id, value::half4)
  PARSE_TYPE(type_id, float)
  PARSE_TYPE(type_id, value::float2)
  PARSE_TYPE(type_id, value::float3)
  PARSE_TYPE(type_id, value::float4)
  PARSE_TYPE(type_id, double)
  PARSE_TYPE(type_id, value::double2)
  PARSE_TYPE(type_id, value::double3)
  PARSE_TYPE(type_id, value::double4)
  PARSE_TYPE(type_id, value::quath)
  PARSE_TYPE(type_id, value::quatf)
  PARSE_TYPE(type_id, value::quatd)
  PARSE_TYPE(type_id, value::color3f)
  PARSE_TYPE(type_id, value::color4f)
  PARSE_TYPE(type_id, value::color3d)
  PARSE_TYPE(type_id, value::color4d)
  PARSE_TYPE(type_id, value::vector3f)
  PARSE_TYPE(type_id, value::normal3f)
  PARSE_TYPE(type_id, value::point3f)
  PARSE_TYPE(type_id, value::texcoord2f)
  PARSE_TYPE(type_id, value::texcoord3f)
  PARSE_TYPE(type_id, value::matrix2f)
  PARSE_TYPE(type_id, value::matrix3f)
  PARSE_TYPE(type_id, value::matrix4f)
  PARSE_TYPE(type_id, value::matrix2d)
  PARSE_TYPE(type_id, value::matrix3d)
  PARSE_TYPE(type_id, value::matrix4d) {
    PUSH_ERROR_AND_RETURN(" : TODO: timeSamples type " + value::GetTypeName(type_id));
  }

#undef PARSE_TYPE

  (*result) = val;

  return true;

}